

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_engine.cpp
# Opt level: O2

int __thiscall zmq::udp_engine_t::add_membership(udp_engine_t *this,fd_t s_,udp_address_t *addr_)

{
  int iVar1;
  int rc_;
  ip_addr_t *piVar2;
  socklen_t __optname;
  socklen_t __optlen;
  ip_mreq mreq;
  
  piVar2 = udp_address_t::target_addr(addr_);
  iVar1 = ip_addr_t::family(piVar2);
  if (iVar1 == 2) {
    mreq.imr_multiaddr.s_addr = (piVar2->ipv6).sin6_flowinfo;
    piVar2 = udp_address_t::bind_addr(addr_);
    mreq.imr_interface.s_addr = (piVar2->ipv6).sin6_flowinfo;
    __optname = 0x23;
    iVar1 = 0;
    __optlen = 8;
  }
  else {
    iVar1 = ip_addr_t::family(piVar2);
    rc_ = 0;
    if (iVar1 != 10) goto LAB_001cc5e8;
    iVar1 = udp_address_t::bind_if(addr_);
    if (iVar1 < -1) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","iface >= -1",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/udp_engine.cpp"
              ,0x14b);
      fflush(_stderr);
      zmq_abort("iface >= -1");
    }
    mreq = *(ip_mreq *)((piVar2->generic).sa_data + 6);
    iVar1 = 0x29;
    __optname = 0x14;
    __optlen = __optname;
  }
  rc_ = setsockopt(s_,iVar1,__optname,&mreq,__optlen);
LAB_001cc5e8:
  assert_success_or_recoverable(s_,rc_);
  return rc_;
}

Assistant:

int zmq::udp_engine_t::add_membership (fd_t s_, const udp_address_t *addr_)
{
    const ip_addr_t *mcast_addr = addr_->target_addr ();
    int rc = 0;

    if (mcast_addr->family () == AF_INET) {
        struct ip_mreq mreq;
        mreq.imr_multiaddr = mcast_addr->ipv4.sin_addr;
        mreq.imr_interface = addr_->bind_addr ()->ipv4.sin_addr;

        rc = setsockopt (s_, IPPROTO_IP, IP_ADD_MEMBERSHIP,
                         reinterpret_cast<char *> (&mreq), sizeof (mreq));

    } else if (mcast_addr->family () == AF_INET6) {
        struct ipv6_mreq mreq;
        const int iface = addr_->bind_if ();

        zmq_assert (iface >= -1);

        mreq.ipv6mr_multiaddr = mcast_addr->ipv6.sin6_addr;
        mreq.ipv6mr_interface = iface;

        rc = setsockopt (s_, IPPROTO_IPV6, IPV6_ADD_MEMBERSHIP,
                         reinterpret_cast<char *> (&mreq), sizeof (mreq));
    }

    assert_success_or_recoverable (s_, rc);
    return rc;
}